

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate.cc
# Opt level: O0

unique_ptr<bssl::Certificate,_std::default_delete<bssl::Certificate>_>
bssl::Certificate::FromDER(Span<const_unsigned_char> der,string *out_diagnostic)

{
  bool bVar1;
  pointer this;
  Certificate *this_00;
  __uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true> this_01;
  Span<const_unsigned_char> cert;
  unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_> local_70;
  undefined1 local_65;
  unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_> local_58;
  __single_object internals;
  undefined1 local_38 [8];
  shared_ptr<const_bssl::ParsedCertificate> result;
  string *out_diagnostic_local;
  Span<const_unsigned_char> der_local;
  unique_ptr<bssl::Certificate,_std::default_delete<bssl::Certificate>_> *ret;
  
  cert.size_ = der.size_;
  this_01.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>._M_t.
  super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
  super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl =
       (__uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>)der.data_;
  cert.data_ = local_38;
  anon_unknown_6::ParseCertificateFromDer(cert,out_diagnostic);
  bVar1 = ::std::operator==((shared_ptr<const_bssl::ParsedCertificate> *)local_38,(nullptr_t)0x0);
  if (bVar1) {
    ::std::unique_ptr<bssl::Certificate,std::default_delete<bssl::Certificate>>::
    unique_ptr<std::default_delete<bssl::Certificate>,void>
              ((unique_ptr<bssl::Certificate,std::default_delete<bssl::Certificate>> *)
               this_01.
               super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>.
               _M_t.
               super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
               super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl,(nullptr_t)0x0);
    internals._M_t.
    super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ._M_t.
    super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
    .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl._4_4_ = 1;
  }
  else {
    ::std::make_unique<bssl::CertificateInternals>();
    this = ::std::
           unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
           ::operator->(&local_58);
    ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=
              (&this->cert,(shared_ptr<const_bssl::ParsedCertificate> *)local_38);
    local_65 = 0;
    this_00 = (Certificate *)operator_new(8);
    ::std::unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ::unique_ptr(&local_70,&local_58);
    Certificate(this_00,&local_70);
    ::std::unique_ptr<bssl::Certificate,std::default_delete<bssl::Certificate>>::
    unique_ptr<std::default_delete<bssl::Certificate>,void>
              ((unique_ptr<bssl::Certificate,std::default_delete<bssl::Certificate>> *)
               this_01.
               super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>.
               _M_t.
               super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
               super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl,this_00);
    ::std::unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ::~unique_ptr(&local_70);
    internals._M_t.
    super___uniq_ptr_impl<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ._M_t.
    super__Tuple_impl<0UL,_bssl::CertificateInternals_*,_std::default_delete<bssl::CertificateInternals>_>
    .super__Head_base<0UL,_bssl::CertificateInternals_*,_false>._M_head_impl._4_4_ = 1;
    local_65 = 1;
    ::std::unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
    ::~unique_ptr(&local_58);
  }
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)local_38);
  return (__uniq_ptr_data<bssl::Certificate,_std::default_delete<bssl::Certificate>,_true,_true>)
         (tuple<bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>)
         this_01.super___uniq_ptr_impl<bssl::Certificate,_std::default_delete<bssl::Certificate>_>.
         _M_t.super__Tuple_impl<0UL,_bssl::Certificate_*,_std::default_delete<bssl::Certificate>_>.
         super__Head_base<0UL,_bssl::Certificate_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Certificate> Certificate::FromDER(bssl::Span<const uint8_t> der,
                                                  std::string *out_diagnostic) {
  std::shared_ptr<const bssl::ParsedCertificate> result =
      ParseCertificateFromDer(der, out_diagnostic);
  if (result == nullptr) {
    return nullptr;
  }

  auto internals = std::make_unique<CertificateInternals>();
  internals->cert = std::move(result);
  std::unique_ptr<Certificate> ret(new Certificate(std::move(internals)));
  return ret;
}